

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtypes.c
# Opt level: O3

fourcc_t StringToFourCC(tchar_t *In,bool_t Upper)

{
  ulong uVar1;
  tchar_t s [5];
  undefined4 local_10;
  
  if (*In == '\0') {
    return 0;
  }
  tcscpy_s((tchar_t *)&local_10,5,In);
  if (Upper != 0) {
    tcsupr((tchar_t *)&local_10);
  }
  uVar1 = 0;
  do {
    if (*(char *)((long)&local_10 + uVar1 + 1) == '\0') {
      memset((void *)((long)&local_10 + uVar1 + 1),0x5f,3 - uVar1);
      return local_10;
    }
    uVar1 = uVar1 + 1;
  } while (uVar1 < 3);
  return local_10;
}

Assistant:

fourcc_t StringToFourCC(const tchar_t* In, bool_t Upper)
{
    tchar_t s[4+1];
    size_t i;

    if (!In[0])
        return 0;

    tcscpy_s(s,TSIZEOF(s),In);

    if (Upper)
        tcsupr(s);

    for (i=1;i<4;++i)
        if (!s[i])
            for (;i<4;++i)
                s[i] = '_';

    return FOURCC((uint8_t)s[0],(uint8_t)s[1],(uint8_t)s[2],(uint8_t)s[3]);
}